

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmetadata_p.h
# Opt level: O2

QDateTime __thiscall QFileSystemMetaData::accessTime(QFileSystemMetaData *this)

{
  long in_RSI;
  long in_FS_OFFSET;
  Data local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RSI + 0x10) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QDateTime::QDateTime((QDateTime *)this);
      return (QDateTime)(Data)this;
    }
  }
  else {
    local_20 = (Data)0x2;
    QDateTime::fromMSecsSinceEpoch
              ((QDateTime *)this,*(long *)(in_RSI + 0x10),(QTimeZone *)&local_20.s);
    QTimeZone::~QTimeZone((QTimeZone *)&local_20.s);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return (QDateTime)(Data)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

inline QDateTime QFileSystemMetaData::accessTime() const
{
    return accessTime_
        ? QDateTime::fromMSecsSinceEpoch(accessTime_, QTimeZone::UTC)
        : QDateTime();
}